

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPrePartialsStates
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          int *states2,float *matrices2,int startPattern,int endPattern)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  lVar10 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  if (0 < lVar10) {
    iVar5 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
    iVar11 = startPattern * 4;
    lVar15 = 0;
    do {
      if (startPattern < endPattern) {
        auVar1 = *(undefined1 (*) [16])(matrices1 + lVar15 * 0x14);
        auVar2 = *(undefined1 (*) [16])(matrices1 + lVar15 * 0x14 + 5);
        auVar3 = *(undefined1 (*) [16])(matrices1 + lVar15 * 0x14 + 10);
        auVar4 = *(undefined1 (*) [16])(matrices1 + lVar15 * 0x14 + 0xf);
        lVar12 = 0;
        lVar14 = (long)endPattern - (long)startPattern;
        do {
          lVar13 = (long)*(int *)((long)states2 + lVar12 + (long)startPattern * 4) +
                   (long)((int)lVar15 * 0x14);
          fVar6 = partials1[iVar11 + lVar12] * matrices2[lVar13];
          fVar7 = partials1[(long)iVar11 + lVar12 + 1] * matrices2[lVar13 + 5];
          fVar8 = partials1[(long)iVar11 + lVar12 + 2] * matrices2[lVar13 + 10];
          fVar9 = partials1[(long)iVar11 + lVar12 + 3] * matrices2[lVar13 + 0xf];
          auVar18._0_4_ = auVar2._0_4_ * fVar7;
          auVar18._4_4_ = auVar2._4_4_ * fVar7;
          auVar18._8_4_ = auVar2._8_4_ * fVar7;
          auVar18._12_4_ = auVar2._12_4_ * fVar7;
          auVar16._4_4_ = fVar6;
          auVar16._0_4_ = fVar6;
          auVar16._8_4_ = fVar6;
          auVar16._12_4_ = fVar6;
          auVar16 = vfmadd213ps_fma(auVar16,auVar1,auVar18);
          auVar19._4_4_ = fVar8;
          auVar19._0_4_ = fVar8;
          auVar19._8_4_ = fVar8;
          auVar19._12_4_ = fVar8;
          auVar16 = vfmadd213ps_fma(auVar19,auVar3,auVar16);
          auVar17._4_4_ = fVar9;
          auVar17._0_4_ = fVar9;
          auVar17._8_4_ = fVar9;
          auVar17._12_4_ = fVar9;
          auVar16 = vfmadd213ps_fma(auVar17,auVar4,auVar16);
          *(undefined1 (*) [16])(destP + iVar11 + lVar12) = auVar16;
          lVar12 = lVar12 + 4;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      lVar15 = lVar15 + 1;
      iVar11 = iVar11 + iVar5 * 4;
    } while (lVar15 != lVar10);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const int* states2,
                                                                    const REALTYPE* matrices2,
                                                                    int startPattern,
                                                                    int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
            u += 4*startPattern;
        }
        int w = l*4*OFFSET;


        PREFETCH_MATRIX_TRANSPOSE(1, matrices1, w); //m100, m101, ..., m133
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1, partials1, u); // p10, p11, p12, p13

            const int state2 = states2[k];
            PREFETCH_MATRIX_COLUMN(2, matrices2, w + state2); // sum20, sum21, sum22, sum23

            DO_SCHUR_PRODUCT(1, 1, 2); // reWrites p10, p11, p12, p13

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13

            // Final results
            destP[u] = sum10;
            destP[u + 1] = sum11;
            destP[u + 2] = sum12;
            destP[u + 3] = sum13;

            u += 4;

        }
    }
}